

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O0

void QBenchmarkValgrindUtils::cleanup(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  bool removeOk;
  QFileInfo *fileInfo;
  QFileInfoList *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QFileInfoList fiList;
  QString base;
  QStringList nameFilters;
  undefined4 in_stack_fffffffffffffe88;
  SortFlag in_stack_fffffffffffffe8c;
  enum_type in_stack_fffffffffffffe90;
  enum_type in_stack_fffffffffffffe94;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  QByteArrayView *in_stack_fffffffffffffea0;
  int fieldWidth;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  QString *in_stack_fffffffffffffeb0;
  QString *pQVar3;
  QChar in_stack_fffffffffffffede;
  undefined1 local_100 [24];
  QFileInfo *local_e8;
  const_iterator local_e0;
  const_iterator local_d8 [2];
  undefined1 local_c8 [24];
  QDir local_b0 [8];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QChar local_8a;
  storage_type *local_88;
  undefined1 local_78 [48];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x1ae1e4);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  QList<QString>::operator<<
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (parameter_type)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  QByteArrayView::QByteArrayView<5ul>
            (in_stack_fffffffffffffea0,
             (char (*) [5])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  fieldWidth = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  QVar2.m_data = local_88;
  QVar2.m_size = (qsizetype)local_78;
  QString::fromLatin1(QVar2);
  QChar::QChar<char16_t,_true>(&local_8a,L' ');
  QString::arg<QString,_true>
            (in_stack_fffffffffffffeb0,
             (QString *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),fieldWidth,
             in_stack_fffffffffffffede);
  QList<QString>::operator<<
            ((QList<QString> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  QString::~QString((QString *)0x1ae2c6);
  QString::~QString((QString *)0x1ae2d3);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QString *)local_c8;
  QString::QString((QString *)0x1ae306);
  QDir::QDir(local_b0,pQVar3);
  operator|(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
  QFlags<QDir::SortFlag>::QFlags
            ((QFlags<QDir::SortFlag> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)
             ,in_stack_fffffffffffffe8c);
  QDir::entryInfoList((QList_conflict *)&local_a8,(QFlags_conflict *)local_b0,
                      (QFlags_conflict *)&local_28);
  QDir::~QDir(local_b0);
  QString::~QString((QString *)0x1ae384);
  local_d8[0].i = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8[0] = QList<QFileInfo>::begin
                          ((QList<QFileInfo> *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  local_e0.i = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = QList<QFileInfo>::end
                       ((QList<QFileInfo> *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  while( true ) {
    local_e8 = local_e0.i;
    bVar1 = QList<QFileInfo>::const_iterator::operator!=(local_d8,local_e0);
    if (!bVar1) break;
    QList<QFileInfo>::const_iterator::operator*(local_d8);
    QFileInfo::fileName();
    QFile::remove((QString *)local_100);
    QString::~QString((QString *)0x1ae472);
    QList<QFileInfo>::const_iterator::operator++(local_d8);
  }
  QList<QFileInfo>::~QList((QList<QFileInfo> *)0x1ae570);
  QString::~QString((QString *)0x1ae57d);
  QList<QString>::~QList((QList<QString> *)0x1ae58a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBenchmarkValgrindUtils::cleanup()
{
    QStringList nameFilters;
    QString base = QBenchmarkGlobalData::current->callgrindOutFileBase;
    Q_ASSERT(!base.isEmpty());
    nameFilters
        << base // overall summary
        << QString::fromLatin1("%1.*").arg(base); // individual dumps
    const QFileInfoList fiList = QDir().entryInfoList(nameFilters, QDir::Files | QDir::Readable);
    for (const QFileInfo &fileInfo : fiList) {
        const bool removeOk = QFile::remove(fileInfo.fileName());
        Q_ASSERT(removeOk);
        Q_UNUSED(removeOk);
    }
}